

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.cpp
# Opt level: O1

void __thiscall Clasp::SmallClauseAlloc::~SmallClauseAlloc(SmallClauseAlloc *this)

{
  Block *pBVar1;
  Block *pBVar2;
  
  pBVar2 = this->blocks_;
  while (pBVar2 != (Block *)0x0) {
    pBVar1 = pBVar2->next;
    operator_delete(pBVar2);
    pBVar2 = pBVar1;
  }
  return;
}

Assistant:

SmallClauseAlloc::~SmallClauseAlloc() {
	Block* r = blocks_;
	while (r) {
		Block* t = r;
		r = r->next;
		::operator delete(t);
	}
}